

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O1

value * mjs::string_match(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                         string *str,value *regexp)

{
  void *pvVar1;
  regexp_object *prVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint32_t index;
  uint uVar5;
  double dVar6;
  double dVar7;
  object_ptr res;
  gc_heap_ptr<mjs::regexp_object> re;
  value match;
  gc_heap_ptr_untyped local_f8;
  gc_heap_ptr_untyped local_e8;
  wstring local_d8;
  gc_heap *local_b8;
  undefined8 local_b0;
  wchar_t *local_a8;
  wstring_view local_a0;
  undefined1 local_90 [40];
  gc_heap_ptr_untyped local_68;
  value local_58;
  
  anon_unknown_35::to_regexp_object((anon_unknown_35 *)&local_e8,global,regexp);
  pvVar1 = gc_heap_ptr_untyped::get(&local_e8);
  if ((*(byte *)((long)pvVar1 + 0x38) & 1) == 0) {
    prVar2 = (regexp_object *)gc_heap_ptr_untyped::get(&local_e8);
    regexp_object::exec(__return_storage_ptr__,prVar2,str);
  }
  else {
    pvVar1 = gc_heap_ptr_untyped::get(&local_e8);
    value_representation::value_representation((value_representation *)local_90,0.0);
    *(ulong *)((long)pvVar1 + 0x30) = CONCAT44(local_90._4_4_,local_90._0_4_);
    make_array((gc_heap_ptr<mjs::global_object> *)&local_f8,(uint32_t)global);
    pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    local_b8 = *(gc_heap **)((long)pvVar1 + 8);
    uVar5 = 0;
    while( true ) {
      prVar2 = (regexp_object *)gc_heap_ptr_untyped::get(&local_e8);
      dVar6 = regexp_object::last_index(prVar2);
      prVar2 = (regexp_object *)gc_heap_ptr_untyped::get(&local_e8);
      regexp_object::exec((value *)local_90,prVar2,str);
      if (local_90._0_4_ != object) break;
      plVar3 = (long *)gc_heap_ptr_untyped::get(&local_f8);
      index_string_abi_cxx11_(&local_d8,(mjs *)(ulong)uVar5,index);
      local_a0._M_len = local_d8._M_string_length;
      local_a0._M_str = local_d8._M_dataplus._M_p;
      string::string((string *)&local_68,local_b8,&local_a0);
      puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_90 + 8));
      local_b0 = 1;
      local_a8 = L"0";
      (**(code **)*puVar4)(&local_58,puVar4,&local_b0);
      (**(code **)(*plVar3 + 8))(plVar3,&local_68,&local_58,0);
      value::destroy(&local_58);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity * 4 + 4);
      }
      prVar2 = (regexp_object *)gc_heap_ptr_untyped::get(&local_e8);
      dVar7 = regexp_object::last_index(prVar2);
      if ((dVar6 == dVar7) && (!NAN(dVar6) && !NAN(dVar7))) {
        pvVar1 = gc_heap_ptr_untyped::get(&local_e8);
        value_representation::value_representation
                  ((value_representation *)&local_58,(double)((long)(dVar6 + 1.0) & 0xffffffff));
        *(undefined8 *)((long)pvVar1 + 0x30) = local_58._0_8_;
      }
      value::destroy((value *)local_90);
      uVar5 = uVar5 + 1;
    }
    if (local_90._0_4_ != null) {
      __assert_fail("match.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                    ,0x1af,
                    "value mjs::string_match(const gc_heap_ptr<global_object> &, const string &, const value &)"
                   );
    }
    value::destroy((value *)local_90);
    __return_storage_ptr__->type_ = object;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_f8.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_f8.pos_;
    if (local_f8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_f8.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_f8);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

value string_match(const gc_heap_ptr<global_object>& global, const string& str, const value& regexp) {
    auto re = to_regexp_object(global, regexp);
    if ((re->flags() & regexp_flag::global) == regexp_flag::none) {
        return re->exec(str);
    }
    // Global regexp
    re->last_index(0);

    auto res = make_array(global, 0);
    auto& h = global->heap();
    for (uint32_t i=0;; ++i) {
        const auto last_index_before = re->last_index();
        auto match = re->exec(str);
        if (match.type() == value_type::null) {
            break;
        }
        assert(match.type() == value_type::object);
        const auto& match_object = match.object_value();
        res->put(string{h, index_string(i)}, match_object->get(L"0"));
        if (last_index_before == re->last_index()) {
            // Empty match
            re->last_index(static_cast<uint32_t>(last_index_before + 1));
        }
    }
    return value{res};
}